

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O1

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>::
ContIntStateScatterReactions
          (ChContactNSC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_> *this,
          uint off_L,ChVectorDynamic<> *L)

{
  long lVar1;
  double *pdVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = (ulong)off_L;
  lVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar4 < lVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    (this->react_force).m_data[0] = pdVar2[uVar4];
    uVar5 = (ulong)(off_L + 1);
    if ((long)uVar5 < lVar1) {
      (this->react_force).m_data[1] = pdVar2[uVar5];
      uVar6 = (ulong)(off_L + 2);
      if ((long)uVar6 < lVar1) {
        (this->react_force).m_data[2] = pdVar2[uVar6];
        pfVar3 = this->reactions_cache;
        if (pfVar3 != (float *)0x0) {
          *pfVar3 = (float)pdVar2[uVar4];
          pfVar3[1] = (float)pdVar2[uVar5];
          pfVar3[2] = (float)pdVar2[uVar6];
        }
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

virtual void ContIntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) override {
        react_force.x() = L(off_L);
        react_force.y() = L(off_L + 1);
        react_force.z() = L(off_L + 2);

        if (reactions_cache) {
            reactions_cache[0] = (float)L(off_L);      // react_force.x();
            reactions_cache[1] = (float)L(off_L + 1);  // react_force.y();
            reactions_cache[2] = (float)L(off_L + 2);  // react_force.z();
        }
    }